

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O2

Block * __thiscall wasm::ReReloop::makeCFGBlock(ReReloop *this)

{
  Relooper *this_00;
  Block *CodeInit;
  Block *pBVar1;
  
  this_00 = (this->relooper)._M_t.
            super___uniq_ptr_impl<CFG::Relooper,_std::default_delete<CFG::Relooper>_>._M_t.
            super__Tuple_impl<0UL,_CFG::Relooper_*,_std::default_delete<CFG::Relooper>_>.
            super__Head_base<0UL,_CFG::Relooper_*,_false>._M_head_impl;
  CodeInit = MixedArena::alloc<wasm::Block>
                       (&((this->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                         allocator);
  pBVar1 = CFG::Relooper::AddBlock(this_00,(Expression *)CodeInit,(Expression *)0x0);
  return pBVar1;
}

Assistant:

CFG::Block* makeCFGBlock() {
    return relooper->AddBlock(builder->makeBlock());
  }